

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void impl_GLSL_UseProgram(MOJOSHADER_glProgram *program)

{
  PFNGLUSEPROGRAMPROC UNRECOVERED_JUMPTABLE_00;
  
  if (ctx->have_opengl_2 == 0) {
    UNRECOVERED_JUMPTABLE_00 = (PFNGLUSEPROGRAMPROC)ctx->glUseProgramObjectARB;
  }
  else {
    UNRECOVERED_JUMPTABLE_00 = ctx->glUseProgram;
  }
  if (program != (MOJOSHADER_glProgram *)0x0) {
    (*UNRECOVERED_JUMPTABLE_00)(program->handle);
    return;
  }
  (*UNRECOVERED_JUMPTABLE_00)(0);
  return;
}

Assistant:

static void impl_GLSL_UseProgram(MOJOSHADER_glProgram *program)
{
    if (ctx->have_opengl_2)
        ctx->glUseProgram(program ? program->handle : 0);
    else
        ctx->glUseProgramObjectARB((GLhandleARB) (program ? program->handle : 0));
}